

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void fieldsel(LexState *ls,expdesc *v)

{
  undefined1 local_38 [8];
  expdesc key;
  FuncState *fs;
  expdesc *v_local;
  LexState *ls_local;
  
  key._16_8_ = ls->fs;
  luaK_exp2anyregup((FuncState *)key._16_8_,v);
  luaX_next(ls);
  checkname(ls,(expdesc *)local_38);
  luaK_indexed((FuncState *)key._16_8_,v,(expdesc *)local_38);
  return;
}

Assistant:

static void fieldsel(LexState *ls, expdesc *v) {
    /* fieldsel -> ['.' | ':'] NAME */
    FuncState *fs = ls->fs;
    expdesc key;
    luaK_exp2anyregup(fs, v);
    luaX_next(ls);  /* skip the dot or colon */
    checkname(ls, &key);
    luaK_indexed(fs, v, &key);
}